

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

SPIRFunction * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::allocate<spirv_cross::SPIRFunction&>
          (ObjectPool<spirv_cross::SPIRFunction> *this,SPIRFunction *p)

{
  size_t sVar1;
  bool bVar2;
  _Tuple_impl<0UL,_spirv_cross::SPIRFunction_*,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>
  _Var3;
  ulong uVar4;
  uint uVar5;
  _Head_base<0UL,_spirv_cross::SPIRFunction_*,_false> _Var6;
  SPIRFunction *pSVar7;
  
  if ((this->vacants).super_VectorView<spirv_cross::SPIRFunction_*>.buffer_size == 0) {
    uVar5 = this->start_object_count <<
            ((byte)(this->memory).
                   super_VectorView<std::unique_ptr<spirv_cross::SPIRFunction,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>_>
                   .buffer_size & 0x1f);
    uVar4 = (ulong)uVar5;
    _Var3.super__Head_base<0UL,_spirv_cross::SPIRFunction_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRFunction_*,_false>)malloc(uVar4 * 800);
    if (_Var3.super__Head_base<0UL,_spirv_cross::SPIRFunction_*,_false>._M_head_impl !=
        (SPIRFunction *)0x0) {
      _Var6._M_head_impl =
           (SPIRFunction *)
           _Var3.super__Head_base<0UL,_spirv_cross::SPIRFunction_*,_false>._M_head_impl;
      if (uVar5 != 0) {
        do {
          SmallVector<spirv_cross::SPIRFunction_*,_0UL>::reserve
                    (&this->vacants,
                     (this->vacants).super_VectorView<spirv_cross::SPIRFunction_*>.buffer_size + 1);
          sVar1 = (this->vacants).super_VectorView<spirv_cross::SPIRFunction_*>.buffer_size;
          (this->vacants).super_VectorView<spirv_cross::SPIRFunction_*>.ptr[sVar1] =
               _Var6._M_head_impl;
          (this->vacants).super_VectorView<spirv_cross::SPIRFunction_*>.buffer_size = sVar1 + 1;
          uVar4 = uVar4 - 1;
          _Var6._M_head_impl = _Var6._M_head_impl + 1;
        } while (uVar4 != 0);
      }
      SmallVector<std::unique_ptr<spirv_cross::SPIRFunction,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>,_8UL>
      ::reserve(&this->memory,
                (this->memory).
                super_VectorView<std::unique_ptr<spirv_cross::SPIRFunction,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>_>
                .buffer_size + 1);
      sVar1 = (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRFunction,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>_>
              .buffer_size;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRFunction,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>_>
      .ptr[sVar1]._M_t.
      super___uniq_ptr_impl<spirv_cross::SPIRFunction,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_spirv_cross::SPIRFunction_*,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>
      .super__Head_base<0UL,_spirv_cross::SPIRFunction_*,_false> =
           _Var3.super__Head_base<0UL,_spirv_cross::SPIRFunction_*,_false>._M_head_impl;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRFunction,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>_>
      .buffer_size = sVar1 + 1;
      if (_Var3.super__Head_base<0UL,_spirv_cross::SPIRFunction_*,_false>._M_head_impl !=
          (SPIRFunction *)0x0) goto LAB_0034b638;
    }
    pSVar7 = (SPIRFunction *)0x0;
  }
  else {
LAB_0034b638:
    sVar1 = (this->vacants).super_VectorView<spirv_cross::SPIRFunction_*>.buffer_size;
    pSVar7 = (this->vacants).super_VectorView<spirv_cross::SPIRFunction_*>.ptr[sVar1 - 1];
    if (sVar1 != 0) {
      SmallVector<spirv_cross::SPIRFunction_*,_0UL>::resize(&this->vacants,sVar1 - 1);
    }
    (pSVar7->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__IVariant_003fd260;
    (pSVar7->super_IVariant).self.id = (p->super_IVariant).self.id;
    (pSVar7->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRFunction_003fe988;
    *(undefined8 *)&(pSVar7->super_IVariant).field_0xc =
         *(undefined8 *)&(p->super_IVariant).field_0xc;
    (pSVar7->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr =
         (Parameter *)0x0;
    (pSVar7->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size = 0;
    (pSVar7->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr =
         (Parameter *)&(pSVar7->arguments).stack_storage;
    (pSVar7->arguments).buffer_capacity = 8;
    SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::operator=
              (&pSVar7->arguments,&p->arguments);
    (pSVar7->shadow_arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr =
         (Parameter *)0x0;
    (pSVar7->shadow_arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size =
         0;
    (pSVar7->shadow_arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr =
         (Parameter *)&(pSVar7->shadow_arguments).stack_storage;
    (pSVar7->shadow_arguments).buffer_capacity = 8;
    SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::operator=
              (&pSVar7->shadow_arguments,&p->shadow_arguments);
    (pSVar7->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr =
         (TypedID<(spirv_cross::Types)2> *)0x0;
    (pSVar7->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
    buffer_size = 0;
    (pSVar7->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr =
         (TypedID<(spirv_cross::Types)2> *)&(pSVar7->local_variables).stack_storage;
    (pSVar7->local_variables).buffer_capacity = 8;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::operator=
              (&pSVar7->local_variables,&p->local_variables);
    (pSVar7->entry_block).id = (p->entry_block).id;
    (pSVar7->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.ptr =
         (TypedID<(spirv_cross::Types)6> *)0x0;
    (pSVar7->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.buffer_size = 0;
    (pSVar7->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.ptr =
         (TypedID<(spirv_cross::Types)6> *)&(pSVar7->blocks).stack_storage;
    (pSVar7->blocks).buffer_capacity = 8;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)6>,_8UL>::operator=
              (&pSVar7->blocks,&p->blocks);
    (pSVar7->combined_parameters).
    super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>.ptr =
         (CombinedImageSamplerParameter *)0x0;
    (pSVar7->combined_parameters).
    super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>.buffer_size = 0;
    (pSVar7->combined_parameters).
    super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>.ptr =
         (CombinedImageSamplerParameter *)&(pSVar7->combined_parameters).stack_storage;
    (pSVar7->combined_parameters).buffer_capacity = 8;
    SmallVector<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,_8UL>::operator=
              (&pSVar7->combined_parameters,&p->combined_parameters);
    pSVar7->entry_line = p->entry_line;
    (pSVar7->fixup_hooks_out).buffer_capacity = 0;
    (pSVar7->fixup_hooks_out).super_VectorView<std::function<void_()>_>.ptr =
         (function<void_()> *)0x0;
    (pSVar7->fixup_hooks_out).super_VectorView<std::function<void_()>_>.buffer_size = 0;
    SmallVector<std::function<void_()>,_0UL>::operator=
              (&pSVar7->fixup_hooks_out,&p->fixup_hooks_out);
    (pSVar7->fixup_hooks_in).super_VectorView<std::function<void_()>_>.ptr =
         (function<void_()> *)0x0;
    (pSVar7->fixup_hooks_in).super_VectorView<std::function<void_()>_>.buffer_size = 0;
    (pSVar7->fixup_hooks_in).buffer_capacity = 0;
    SmallVector<std::function<void_()>,_0UL>::operator=(&pSVar7->fixup_hooks_in,&p->fixup_hooks_in);
    (pSVar7->constant_arrays_needed_on_stack).
    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr =
         (TypedID<(spirv_cross::Types)0> *)0x0;
    (pSVar7->constant_arrays_needed_on_stack).
    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size = 0;
    (pSVar7->constant_arrays_needed_on_stack).
    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr =
         (TypedID<(spirv_cross::Types)0> *)&(pSVar7->constant_arrays_needed_on_stack).stack_storage;
    (pSVar7->constant_arrays_needed_on_stack).buffer_capacity = 8;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::operator=
              (&pSVar7->constant_arrays_needed_on_stack,&p->constant_arrays_needed_on_stack);
    bVar2 = p->flush_undeclared;
    pSVar7->active = p->active;
    pSVar7->flush_undeclared = bVar2;
    pSVar7->do_combined_parameters = p->do_combined_parameters;
  }
  return pSVar7;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}